

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManCompressCubes(Vec_Wec_t *vCubes,Vec_Int_t *vLit2Cube)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  undefined4 local_24;
  int k;
  int CubeId;
  int i;
  Vec_Int_t *vLit2Cube_local;
  Vec_Wec_t *vCubes_local;
  
  local_24 = 0;
  for (k = 0; iVar1 = Vec_IntSize(vLit2Cube), k < iVar1; k = k + 1) {
    iVar1 = Vec_IntEntry(vLit2Cube,k);
    p = Vec_WecEntry(vCubes,iVar1);
    iVar2 = Vec_IntSize(p);
    if (0 < iVar2) {
      Vec_IntWriteEntry(vLit2Cube,local_24,iVar1);
      local_24 = local_24 + 1;
    }
  }
  Vec_IntShrink(vLit2Cube,local_24);
  return;
}

Assistant:

static inline void Fx_ManCompressCubes( Vec_Wec_t * vCubes, Vec_Int_t * vLit2Cube )
{
    int i, CubeId, k = 0;
    Vec_IntForEachEntry( vLit2Cube, CubeId, i )
        if ( Vec_IntSize(Vec_WecEntry(vCubes, CubeId)) > 0 )
            Vec_IntWriteEntry( vLit2Cube, k++, CubeId );
    Vec_IntShrink( vLit2Cube, k );
}